

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O2

int ssl_ciphersuite_match
              (mbedtls_ssl_context *ssl,int suite_id,mbedtls_ssl_ciphersuite_t **ciphersuite_info)

{
  mbedtls_ecp_group_id mVar1;
  mbedtls_x509_crt *pmVar2;
  mbedtls_ssl_ciphersuite_t **ppmVar3;
  byte bVar4;
  int iVar5;
  mbedtls_ecp_group_id mVar6;
  mbedtls_pk_type_t type;
  uint uVar7;
  mbedtls_ssl_ciphersuite_t *info;
  int line;
  char *pcVar8;
  uint16_t *curr_tls_id;
  uint16_t *puVar9;
  mbedtls_ssl_key_cert *pmVar10;
  mbedtls_pk_context local_58;
  mbedtls_ssl_ciphersuite_t **local_40;
  uint32_t local_38;
  mbedtls_pk_type_t local_34;
  
  info = mbedtls_ssl_ciphersuite_from_id(suite_id);
  if (info == (mbedtls_ssl_ciphersuite_t *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x326,"should never happen");
    iVar5 = -0x6c00;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x32b,"trying ciphersuite: %#04x (%s)",(ulong)(uint)suite_id,info->name);
    if ((ssl->tls_version < (uint)info->min_tls_version) ||
       ((uint)info->max_tls_version < ssl->tls_version)) {
      pcVar8 = "ciphersuite mismatch: version";
      line = 0x32f;
    }
    else if ((info->key_exchange == '\v') && ((ssl->handshake->cli_exts & 2) == 0)) {
      pcVar8 = "ciphersuite mismatch: ecjpake not configured or ext missing";
      line = 0x337;
    }
    else {
      iVar5 = mbedtls_ssl_ciphersuite_uses_ec(info);
      if ((iVar5 == 0) ||
         ((puVar9 = ssl->handshake->curves_tls_id, puVar9 != (uint16_t *)0x0 && (*puVar9 != 0)))) {
        iVar5 = mbedtls_ssl_ciphersuite_uses_psk(info);
        if ((iVar5 == 0) || (iVar5 = ssl_conf_has_psk_or_cb(ssl->conf), iVar5 != 0)) {
          local_34 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
          if (local_34 == MBEDTLS_PK_NONE) {
LAB_001e0aa6:
            type = mbedtls_ssl_get_ciphersuite_sig_alg(info);
            if (type != MBEDTLS_PK_NONE) {
              bVar4 = mbedtls_ssl_sig_from_pk_alg(type);
              uVar7 = mbedtls_ssl_tls12_get_preferred_hash_for_sig_alg(ssl,(uint)bVar4);
              if (uVar7 == 0) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x369,
                           "ciphersuite mismatch: no suitable hash algorithm for signature algorithm %u"
                           ,(ulong)type);
                return 0;
              }
            }
            *ciphersuite_info = info;
            return 0;
          }
          pmVar10 = ssl->conf->key_cert;
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                     ,0x2cf,"ciphersuite requires certificate");
          ppmVar3 = ciphersuite_info;
          if (pmVar10 == (mbedtls_ssl_key_cert *)0x0) {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                       ,0x2d2,"server has no certificate");
          }
          else {
            for (; local_40 = ppmVar3, pmVar10 != (mbedtls_ssl_key_cert *)0x0;
                pmVar10 = pmVar10->next) {
              local_38 = 0;
              mbedtls_debug_print_crt
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                         ,0x2d9,"candidate certificate chain, certificate",pmVar10->cert);
              iVar5 = mbedtls_pk_can_do(&pmVar10->cert->pk,local_34);
              if (iVar5 == 0) {
                iVar5 = 0x2ea;
                pcVar8 = "certificate mismatch: key type";
              }
              else {
                iVar5 = mbedtls_ssl_check_cert_usage(pmVar10->cert,info,1,&local_38);
                if (iVar5 == 0) {
                  if (local_34 != MBEDTLS_PK_ECDSA) {
LAB_001e0a75:
                    ssl->handshake->key_cert = pmVar10;
                    mbedtls_debug_print_crt
                              (ssl,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                               ,0x30e,"selected certificate chain, certificate",pmVar10->cert);
                    ciphersuite_info = local_40;
                    goto LAB_001e0aa6;
                  }
                  pmVar2 = pmVar10->cert;
                  puVar9 = ssl->handshake->curves_tls_id;
                  local_58.priv_id = (pmVar2->pk).priv_id;
                  local_58._20_4_ = *(undefined4 *)&(pmVar2->pk).field_0x14;
                  local_58.pk_info = (pmVar2->pk).pk_info;
                  local_58.pk_ctx = (pmVar2->pk).pk_ctx;
                  mbedtls_pk_get_type(&local_58);
                  mVar1 = *local_58.pk_ctx;
                  while (*puVar9 != 0) {
                    mVar6 = mbedtls_ssl_get_ecp_group_id_from_tls_id(*puVar9);
                    puVar9 = puVar9 + 1;
                    if (mVar6 == mVar1) goto LAB_001e0a75;
                  }
                  iVar5 = 0x301;
                  pcVar8 = "certificate mismatch: elliptic curve";
                }
                else {
                  iVar5 = 0x2f9;
                  pcVar8 = "certificate mismatch: (extended) key usage extension";
                }
              }
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                         ,iVar5,pcVar8);
              ppmVar3 = local_40;
            }
          }
          pcVar8 = "ciphersuite mismatch: no suitable certificate";
          line = 0x35c;
        }
        else {
          pcVar8 = "ciphersuite mismatch: no pre-shared key";
          line = 0x34d;
        }
      }
      else {
        pcVar8 = "ciphersuite mismatch: no common elliptic curve";
        line = 0x343;
      }
    }
    iVar5 = 0;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,line,pcVar8);
  }
  return iVar5;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_ciphersuite_match(mbedtls_ssl_context *ssl, int suite_id,
                                 const mbedtls_ssl_ciphersuite_t **ciphersuite_info)
{
    const mbedtls_ssl_ciphersuite_t *suite_info;

#if defined(MBEDTLS_KEY_EXCHANGE_WITH_CERT_ENABLED)
    mbedtls_pk_type_t sig_type;
#endif

    suite_info = mbedtls_ssl_ciphersuite_from_id(suite_id);
    if (suite_info == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    MBEDTLS_SSL_DEBUG_MSG(3, ("trying ciphersuite: %#04x (%s)",
                              (unsigned int) suite_id, suite_info->name));

    if (suite_info->min_tls_version > ssl->tls_version ||
        suite_info->max_tls_version < ssl->tls_version) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ciphersuite mismatch: version"));
        return 0;
    }

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if (suite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE &&
        (ssl->handshake->cli_exts & MBEDTLS_TLS_EXT_ECJPAKE_KKPP_OK) == 0) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ciphersuite mismatch: ecjpake "
                                  "not configured or ext missing"));
        return 0;
    }
#endif


#if defined(MBEDTLS_KEY_EXCHANGE_SOME_ECDH_OR_ECDHE_1_2_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDSA_CERT_REQ_ALLOWED_ENABLED)
    if (mbedtls_ssl_ciphersuite_uses_ec(suite_info) &&
        (ssl->handshake->curves_tls_id == NULL ||
         ssl->handshake->curves_tls_id[0] == 0)) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ciphersuite mismatch: "
                                  "no common elliptic curve"));
        return 0;
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_SOME_PSK_ENABLED)
    /* If the ciphersuite requires a pre-shared key and we don't
     * have one, skip it now rather than failing later */
    if (mbedtls_ssl_ciphersuite_uses_psk(suite_info) &&
        ssl_conf_has_psk_or_cb(ssl->conf) == 0) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ciphersuite mismatch: no pre-shared key"));
        return 0;
    }
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    /*
     * Final check: if ciphersuite requires us to have a
     * certificate/key of a particular type:
     * - select the appropriate certificate if we have one, or
     * - try the next ciphersuite if we don't
     * This must be done last since we modify the key_cert list.
     */
    if (ssl_pick_cert(ssl, suite_info) != 0) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ciphersuite mismatch: "
                                  "no suitable certificate"));
        return 0;
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_WITH_CERT_ENABLED)
    /* If the ciphersuite requires signing, check whether
     * a suitable hash algorithm is present. */
    sig_type = mbedtls_ssl_get_ciphersuite_sig_alg(suite_info);
    if (sig_type != MBEDTLS_PK_NONE &&
        mbedtls_ssl_tls12_get_preferred_hash_for_sig_alg(
            ssl, mbedtls_ssl_sig_from_pk_alg(sig_type)) == MBEDTLS_SSL_HASH_NONE) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ciphersuite mismatch: no suitable hash algorithm "
                                  "for signature algorithm %u", (unsigned) sig_type));
        return 0;
    }

#endif /* MBEDTLS_KEY_EXCHANGE_WITH_CERT_ENABLED */

    *ciphersuite_info = suite_info;
    return 0;
}